

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDEdgePtr __thiscall
ON_SubD_FixedSizeHeap::AllocateEdge
          (ON_SubD_FixedSizeHeap *this,ON_SubDVertex *v0,double v0_sector_coefficient,
          ON_SubDVertex *v1,double v1_sector_coefficient)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  ON_SubDEdge *edge;
  ON_SubDEdgePtr OVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  ON_SubDEdgeTag local_7a;
  ON_SubDEdge *e;
  double dStack_38;
  bool bTaggedVertex [2];
  double v1_sector_coefficient_local;
  ON_SubDVertex *v1_local;
  double v0_sector_coefficient_local;
  ON_SubDVertex *v0_local;
  ON_SubD_FixedSizeHeap *this_local;
  
  if ((v0 == (ON_SubDVertex *)0x0) || (v0->m_edges != (ON_SubDEdgePtr *)0x0)) {
    if ((v1 == (ON_SubDVertex *)0x0) || (v1->m_edges != (ON_SubDEdgePtr *)0x0)) {
      if ((this->m_e == (ON_SubDEdge *)0x0) || (this->m_e_capacity <= this->m_e_index)) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubD_FixedSizeHeap *)0;
      }
      else {
        v1_local = (ON_SubDVertex *)v0_sector_coefficient;
        if (v0 == (ON_SubDVertex *)0x0) {
          bVar6 = false;
        }
        else {
          if ((v0->m_edges == (ON_SubDEdgePtr *)0x0) || (v0->m_edge_capacity <= v0->m_edge_count)) {
            ON_SubDIncrementErrorCount();
            return (ON_SubDEdgePtr)0;
          }
          if (v0->m_vertex_tag == Smooth) {
            bVar6 = false;
            v1_local = (ON_SubDVertex *)0.0;
          }
          else {
            bVar6 = v0->m_vertex_tag != Unset;
          }
        }
        dStack_38 = v1_sector_coefficient;
        if (v1 == (ON_SubDVertex *)0x0) {
          bVar7 = false;
        }
        else {
          if ((v1->m_edges == (ON_SubDEdgePtr *)0x0) || (v1->m_edge_capacity <= v1->m_edge_count)) {
            ON_SubDIncrementErrorCount();
            return (ON_SubDEdgePtr)0;
          }
          if (v1->m_vertex_tag == Smooth) {
            bVar7 = false;
            dStack_38 = 0.0;
          }
          else {
            bVar7 = v0->m_vertex_tag != Unset;
            if ((bVar6) && (bVar7)) {
              v1_local = (ON_SubDVertex *)0.0;
              dStack_38 = 0.0;
            }
          }
        }
        bVar2 = ON_SubDSectorType::IsValidSectorCoefficientValue((double)v1_local,true);
        if (bVar2) {
          bVar2 = ON_SubDSectorType::IsValidSectorCoefficientValue(dStack_38,true);
          if (bVar2) {
            edge = this->m_e + this->m_e_index;
            memset(edge,0,0xb0);
            if (this->m_e_index != 0) {
              this->m_e[this->m_e_index - 1].m_next_edge = edge;
              edge->m_prev_edge = this->m_e + (this->m_e_index - 1);
            }
            uVar5 = this->m_e_index + 1;
            this->m_e_index = uVar5;
            (edge->super_ON_SubDComponentBase).m_id = uVar5;
            if (v0 != (ON_SubDVertex *)0x0) {
              edge->m_vertex[0] = v0;
              OVar4 = ON_SubDEdgePtr::Create(edge,0);
              uVar1 = v0->m_edge_count;
              v0->m_edge_count = uVar1 + 1;
              v0->m_edges[uVar1].m_ptr = OVar4.m_ptr;
              uVar5 = ON_SubDComponentBase::SubdivisionLevel(&v0->super_ON_SubDComponentBase);
              ON_SubDComponentBase::SetSubdivisionLevel(&edge->super_ON_SubDComponentBase,uVar5);
            }
            if (v1 != (ON_SubDVertex *)0x0) {
              edge->m_vertex[1] = v1;
              OVar4 = ON_SubDEdgePtr::Create(edge,1);
              uVar1 = v1->m_edge_count;
              v1->m_edge_count = uVar1 + 1;
              v1->m_edges[uVar1].m_ptr = OVar4.m_ptr;
              uVar5 = ON_SubDComponentBase::SubdivisionLevel(&edge->super_ON_SubDComponentBase);
              uVar3 = ON_SubDComponentBase::SubdivisionLevel(&v1->super_ON_SubDComponentBase);
              if (uVar5 < uVar3) {
                uVar5 = ON_SubDComponentBase::SubdivisionLevel(&v1->super_ON_SubDComponentBase);
                ON_SubDComponentBase::SetSubdivisionLevel(&edge->super_ON_SubDComponentBase,uVar5);
              }
            }
            edge->m_sector_coefficient[0] = (double)v1_local;
            edge->m_sector_coefficient[1] = dStack_38;
            bVar2 = false;
            if (bVar6) {
              bVar2 = bVar7;
            }
            local_7a = Crease;
            if (!bVar2) {
              local_7a = Smooth;
            }
            edge->m_edge_tag = local_7a;
            this_local = (ON_SubD_FixedSizeHeap *)ON_SubDEdgePtr::Create(edge,0);
          }
          else {
            ON_SubDIncrementErrorCount();
            this_local = (ON_SubD_FixedSizeHeap *)0;
          }
        }
        else {
          ON_SubDIncrementErrorCount();
          this_local = (ON_SubD_FixedSizeHeap *)0;
        }
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubD_FixedSizeHeap *)0;
    }
  }
  else {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubD_FixedSizeHeap *)0;
  }
  return (ON_SubDEdgePtr)(ON__UINT_PTR)this_local;
}

Assistant:

const ON_SubDEdgePtr ON_SubD_FixedSizeHeap::AllocateEdge(
  ON_SubDVertex* v0,
  double v0_sector_coefficient,
  ON_SubDVertex* v1,
  double v1_sector_coefficient
  )
{
  if ( nullptr != v0 && nullptr == v0->m_edges)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
  if ( nullptr != v1 && nullptr == v1->m_edges)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
  if (nullptr == m_e || m_e_index >= m_e_capacity)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);

  bool bTaggedVertex[2];
  if (nullptr != v0)
  {
    if (nullptr == v0->m_edges || v0->m_edge_count >= v0->m_edge_capacity)
      return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
    if (ON_SubDVertexTag::Smooth == v0->m_vertex_tag)
    {
      bTaggedVertex[0] = false;
      v0_sector_coefficient = ON_SubDSectorType::IgnoredSectorCoefficient;
    }
    else
    {
      bTaggedVertex[0] = (ON_SubDVertexTag::Unset != v0->m_vertex_tag);
    }
  }
  else
    bTaggedVertex[0] = false;

  if (nullptr != v1)
  {
    if (nullptr == v1->m_edges || v1->m_edge_count >= v1->m_edge_capacity)
      return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
    if (ON_SubDVertexTag::Smooth == v1->m_vertex_tag)
    {
      bTaggedVertex[1] = false;
      v1_sector_coefficient = ON_SubDSectorType::IgnoredSectorCoefficient;
    }
    else
    {
      bTaggedVertex[1] = (ON_SubDVertexTag::Unset != v0->m_vertex_tag);
      if (bTaggedVertex[0] && bTaggedVertex[1])
      {
        // crease edge - no weights
        v0_sector_coefficient = ON_SubDSectorType::IgnoredSectorCoefficient;
        v1_sector_coefficient = ON_SubDSectorType::IgnoredSectorCoefficient;
      }
    }
  }
  else
    bTaggedVertex[1] = false;

  if ( false == ON_SubDSectorType::IsValidSectorCoefficientValue(v0_sector_coefficient, true))
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);

  if ( false == ON_SubDSectorType::IsValidSectorCoefficientValue(v1_sector_coefficient, true))
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);

  ON_SubDEdge* e = m_e + m_e_index;
  memset(e, 0, sizeof(*e));
  if (m_e_index > 0)
  {
    // code in ON_SubDFaceNeighborhood.Subdivide() relies on m_next_edge being set this way.
    m_e[m_e_index - 1].m_next_edge = e;
    e->m_prev_edge = &m_e[m_e_index - 1];
  }

  e->m_id = ++m_e_index;

  if (nullptr != v0)
  {
    e->m_vertex[0] = v0;
    v0->m_edges[v0->m_edge_count++] = ON_SubDEdgePtr::Create(e,0);
    //v0->m_vertex_edge_order = ON_SubD::VertexEdgeOrder::unset;
    e->SetSubdivisionLevel(v0->SubdivisionLevel());
  }

  if (nullptr != v1)
  {
    e->m_vertex[1] = v1;
    v1->m_edges[v1->m_edge_count++] = ON_SubDEdgePtr::Create(e,1);
    //v1->m_vertex_edge_order = ON_SubD::VertexEdgeOrder::unset;
    if ( e->SubdivisionLevel() < v1->SubdivisionLevel())
      e->SetSubdivisionLevel(v1->SubdivisionLevel());
  }

  e->m_sector_coefficient[0] = v0_sector_coefficient;
  e->m_sector_coefficient[1] = v1_sector_coefficient;
  e->m_edge_tag = (bTaggedVertex[0] && bTaggedVertex[1]) ? ON_SubDEdgeTag::Crease : ON_SubDEdgeTag::Smooth;

  return ON_SubDEdgePtr::Create(e,0);
}